

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_util.cpp
# Opt level: O2

void spirv_cross_util::inherit_combined_sampler_bindings(Compiler *compiler)

{
  size_t sVar1;
  CombinedImageSampler *pCVar2;
  bool bVar3;
  uint32_t uVar4;
  long lVar5;
  
  sVar1 = (compiler->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  pCVar2 = (compiler->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
           ptr;
  for (lVar5 = 0; sVar1 * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc) {
    bVar3 = spirv_cross::Compiler::has_decoration
                      (compiler,(ID)*(uint32_t *)((long)&(pCVar2->image_id).id + lVar5),
                       DecorationDescriptorSet);
    if (bVar3) {
      uVar4 = spirv_cross::Compiler::get_decoration
                        (compiler,(ID)*(uint32_t *)((long)&(pCVar2->image_id).id + lVar5),
                         DecorationDescriptorSet);
      spirv_cross::Compiler::set_decoration
                (compiler,(ID)*(uint32_t *)((long)&(pCVar2->combined_id).id + lVar5),
                 DecorationDescriptorSet,uVar4);
    }
    bVar3 = spirv_cross::Compiler::has_decoration
                      (compiler,(ID)*(uint32_t *)((long)&(pCVar2->image_id).id + lVar5),
                       DecorationBinding);
    if (bVar3) {
      uVar4 = spirv_cross::Compiler::get_decoration
                        (compiler,(ID)*(uint32_t *)((long)&(pCVar2->image_id).id + lVar5),
                         DecorationBinding);
      spirv_cross::Compiler::set_decoration
                (compiler,(ID)*(uint32_t *)((long)&(pCVar2->combined_id).id + lVar5),
                 DecorationBinding,uVar4);
    }
  }
  return;
}

Assistant:

void inherit_combined_sampler_bindings(Compiler &compiler)
{
	auto &samplers = compiler.get_combined_image_samplers();
	for (auto &s : samplers)
	{
		if (compiler.has_decoration(s.image_id, spv::DecorationDescriptorSet))
		{
			uint32_t set = compiler.get_decoration(s.image_id, spv::DecorationDescriptorSet);
			compiler.set_decoration(s.combined_id, spv::DecorationDescriptorSet, set);
		}

		if (compiler.has_decoration(s.image_id, spv::DecorationBinding))
		{
			uint32_t binding = compiler.get_decoration(s.image_id, spv::DecorationBinding);
			compiler.set_decoration(s.combined_id, spv::DecorationBinding, binding);
		}
	}
}